

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astVariableDefinitionNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long lVar1;
  long lVar2;
  long lVar3;
  _Bool _Var4;
  ulong immediateTypeTag;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t environment;
  anon_struct_56_7_c1bcb7ce gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  undefined1 *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.binding = 0;
  gcFrame.ownerProgramEntitySymbol = 0;
  gcFrame.valueBox = (sysbvm_variableValueBox_t *)0x0;
  gcFrame.value = 0;
  gcFrame.name = 0;
  gcFrame.type = 0;
  gcFrame.ownerProgramEntity = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 7;
  local_40 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_58);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.name = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                           (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  sVar5 = *arguments;
  if (*(long *)(sVar5 + 0x48) == 0x1f) {
    sysbvm_environment_setNewMacroValueBinding
              (context,arguments[1],*(sysbvm_tuple_t *)(sVar5 + 0x10),gcFrame.name,
               *(sysbvm_tuple_t *)(sVar5 + 0x38));
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_58);
    gcFrame.value = 0x2f;
  }
  else {
    if (*(sysbvm_tuple_t *)(sVar5 + 0x30) != 0) {
      gcFrame.type = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                               (context,*(sysbvm_tuple_t *)(sVar5 + 0x30),arguments[1]);
      sVar5 = *arguments;
    }
    if (*(sysbvm_tuple_t *)(sVar5 + 0x38) != 0) {
      gcFrame.value =
           sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                     (context,*(sysbvm_tuple_t *)(sVar5 + 0x38),arguments[1]);
    }
    if (gcFrame.type != 0) {
      gcFrame.value = sysbvm_type_coerceValue(context,gcFrame.type,gcFrame.value);
    }
    sVar5 = *arguments;
    lVar1 = *(long *)(sVar5 + 0x50);
    lVar2 = *(long *)(sVar5 + 0x60);
    lVar3 = *(long *)(sVar5 + 0x68);
    if (lVar1 == 0x1f) {
      if (gcFrame.type == 0) {
        immediateTypeTag = gcFrame.value & 0xf;
        if (immediateTypeTag == 0 && gcFrame.value != 0) {
          gcFrame.type = *(sysbvm_tuple_t *)gcFrame.value;
        }
        else if ((int)immediateTypeTag == 0xf) {
          gcFrame.type = sysbvm_tuple_getImmediateTrivialTypeWithIndex(context,gcFrame.value >> 4);
        }
        else {
          gcFrame.type = sysbvm_tuple_getImmediateTypeWithTag(context,immediateTypeTag);
        }
      }
      gcFrame.type = sysbvm_type_createGenericReferenceType(context,gcFrame.type);
      gcFrame.valueBox =
           (sysbvm_variableValueBox_t *)sysbvm_variableValueBox_with(context,gcFrame.value);
      gcFrame.value =
           sysbvm_referenceType_withStorage(context,gcFrame.type,(sysbvm_tuple_t)gcFrame.valueBox);
      sVar5 = *arguments;
    }
    environment = arguments[1];
    if (*(long *)(sVar5 + 0x58) == 0x1f) {
      sVar5 = sysbvm_symbol_internWithCString(context,"__OwnerProgramEntity__");
      _Var4 = sysbvm_environment_lookSymbolRecursively
                        (context,environment,sVar5,&gcFrame.ownerProgramEntitySymbol);
      if (!_Var4) {
        sysbvm_error("Failed to find __OwnerProgramEntity__");
      }
      _Var4 = sysbvm_symbolBinding_isValue(context,gcFrame.ownerProgramEntitySymbol);
      if (!_Var4) {
        sysbvm_error("Expected a symbol value binding for __OwnerProgramEntity__");
      }
      if (((gcFrame.ownerProgramEntitySymbol & 0xf) == 0 && gcFrame.ownerProgramEntitySymbol != 0)
         && (0x57 < *(uint *)(gcFrame.ownerProgramEntitySymbol + 0xc))) {
        gcFrame.ownerProgramEntity = *(sysbvm_tuple_t *)(gcFrame.ownerProgramEntitySymbol + 0x38);
      }
      else {
        gcFrame.ownerProgramEntity = 0;
      }
      _Var4 = sysbvm_tuple_isKindOf
                        (context,gcFrame.ownerProgramEntity,(context->roots).environmentType);
      if (!_Var4) {
        sysbvm_error("TODO: Set public symbol in non-environment owner.");
      }
      sVar5 = *(sysbvm_tuple_t *)(*arguments + 0x10);
      environment = gcFrame.ownerProgramEntity;
    }
    else {
      sVar5 = *(sysbvm_tuple_t *)(sVar5 + 0x10);
    }
    gcFrame.binding =
         sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition
                   (context,environment,gcFrame.name,gcFrame.value,lVar1 == 0x1f,lVar2 == 0x1f,
                    lVar3 == 0x1f,sVar5);
    if ((gcFrame.valueBox != (sysbvm_variableValueBox_t *)0x0 && lVar1 == 0x1f) &&
        gcFrame.binding != 0) {
      (gcFrame.valueBox)->binding = gcFrame.binding;
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_58);
  }
  return gcFrame.value;
}

Assistant:

static sysbvm_tuple_t sysbvm_astVariableDefinitionNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t name;
        sysbvm_tuple_t type;
        sysbvm_variableValueBox_t *valueBox;
        sysbvm_tuple_t value;
        sysbvm_tuple_t binding;
        sysbvm_tuple_t ownerProgramEntitySymbol;
        sysbvm_tuple_t ownerProgramEntity;
    } gcFrame = {
        .value = SYSBVM_NULL_TUPLE
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_astVariableDefinitionNode_t **variableDefinitionNode = (sysbvm_astVariableDefinitionNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*variableDefinitionNode)->super.sourcePosition);

    gcFrame.name = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*variableDefinitionNode)->nameExpression, *environment);
    if(sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isMacroSymbol))
    {
        sysbvm_environment_setNewMacroValueBinding(context, *environment, (*variableDefinitionNode)->super.sourcePosition, gcFrame.name, (*variableDefinitionNode)->valueExpression);
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return SYSBVM_VOID_TUPLE;
    }

    if((*variableDefinitionNode)->typeExpression)
        gcFrame.type = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*variableDefinitionNode)->typeExpression, *environment);
    if((*variableDefinitionNode)->valueExpression)
        gcFrame.value = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*variableDefinitionNode)->valueExpression, *environment);
    if(gcFrame.type)
        gcFrame.value = sysbvm_type_coerceValue(context, gcFrame.type, gcFrame.value);

    bool isMutable = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isMutable);
    bool isExternal = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isExternal);
    bool isThreadLocal = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isThreadLocal);
    if(isMutable)
    {
        if(!gcFrame.type)
            gcFrame.type = sysbvm_tuple_getType(context, gcFrame.value);
        gcFrame.type = sysbvm_type_createGenericReferenceType(context, gcFrame.type);
        gcFrame.valueBox = (sysbvm_variableValueBox_t*)sysbvm_variableValueBox_with(context, gcFrame.value);
        gcFrame.value = sysbvm_referenceType_withStorage(context, gcFrame.type, (sysbvm_tuple_t)gcFrame.valueBox);
    }

    bool isPublic = sysbvm_tuple_boolean_decode((*variableDefinitionNode)->isPublic);
    if(isPublic)
    {
        if(!sysbvm_environment_lookSymbolRecursively(context, *environment, sysbvm_symbol_internWithCString(context, "__OwnerProgramEntity__"), &gcFrame.ownerProgramEntitySymbol))
            sysbvm_error("Failed to find __OwnerProgramEntity__");
        if(!sysbvm_symbolBinding_isValue(context, gcFrame.ownerProgramEntitySymbol))
            sysbvm_error("Expected a symbol value binding for __OwnerProgramEntity__");

        gcFrame.ownerProgramEntity = sysbvm_symbolValueBinding_getValue(gcFrame.ownerProgramEntitySymbol);
        if(sysbvm_tuple_isKindOf(context, gcFrame.ownerProgramEntity, context->roots.environmentType))
            gcFrame.binding = sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition(context, gcFrame.ownerProgramEntity, gcFrame.name, gcFrame.value, isMutable, isExternal, isThreadLocal, (*variableDefinitionNode)->super.sourcePosition);
        else
            sysbvm_error("TODO: Set public symbol in non-environment owner.");
    }
    else
    {
        gcFrame.binding = sysbvm_environment_setNewSymbolBindingWithValueAndFlagsAtSourcePosition(context, *environment, gcFrame.name, gcFrame.value, isMutable, isExternal, isThreadLocal, (*variableDefinitionNode)->super.sourcePosition);
    }

    // Store a copy of the binding itself in the value box.
    if(isMutable && gcFrame.binding && gcFrame.valueBox)
        gcFrame.valueBox->binding = gcFrame.binding;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.value;
}